

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcp.cc
# Opt level: O1

int main(int argc,char **argv)

{
  char *pcVar1;
  long lVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  uint uVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX_01;
  ostream *poVar8;
  size_t sVar9;
  char **ppcVar10;
  string *this;
  long lVar11;
  long lVar12;
  int iVar13;
  bool bVar14;
  int input_block_length;
  int output_block_length;
  int input_end_number;
  int input_start_number;
  int output_start_number;
  double pad_value;
  ostringstream error_message_14;
  BlockCopyWrapper block_copy;
  string data_type;
  ifstream ifs;
  int local_424;
  int local_420;
  int local_41c;
  int local_418;
  int local_414;
  char *local_410;
  ulong local_408;
  string local_400;
  double local_3e0;
  string local_3d8 [3];
  ios_base local_368 [264];
  BlockCopyWrapper local_260;
  string local_258;
  string local_238;
  byte abStack_218 [80];
  ios_base local_1c8 [408];
  
  local_418 = 0;
  local_41c = 0x1ff;
  local_424 = 0x200;
  local_408 = 0;
  local_414 = 0;
  local_420 = 0x200;
  local_3e0 = 0.0;
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"d","");
  local_410 = (char *)0x0;
  iVar13 = 0;
  do {
    iVar5 = ya_getopt_long(argc,argv,"s:e:l:m:S:L:M:f:h",(option *)0x0,(int *)0x0);
    if (iVar5 < 0x53) {
      if (iVar5 != -1) {
        if (iVar5 == 0x4c) {
          std::__cxx11::string::string((string *)&local_238,ya_optarg,(allocator *)local_3d8);
          bVar14 = sptk::ConvertStringToInteger(&local_238,&local_420);
          bVar3 = 0 < local_420;
          paVar7 = &local_238.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p != paVar7) {
            operator_delete(local_238._M_dataplus._M_p);
            paVar7 = extraout_RAX_01;
          }
          if (bVar14 && bVar3) {
LAB_001039f2:
            local_408 = CONCAT71((int7)((ulong)paVar7 >> 8),1);
            goto LAB_00103ca8;
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_238,
                     "The argument for the -L option must be a positive integer",0x39);
          local_3d8[0]._M_dataplus._M_p = (pointer)&local_3d8[0].field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_3d8,"bcp","");
          sptk::PrintErrorMessage(local_3d8,(ostringstream *)&local_238);
        }
        else {
          if (iVar5 != 0x4d) goto switchD_001038ca_caseD_67;
          std::__cxx11::string::string((string *)&local_238,ya_optarg,(allocator *)local_3d8);
          bVar3 = sptk::ConvertStringToInteger(&local_238,&local_420);
          bVar14 = -1 < local_420;
          paVar7 = &local_238.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p != paVar7) {
            operator_delete(local_238._M_dataplus._M_p);
            paVar7 = extraout_RAX_00;
          }
          if (bVar3 && bVar14) {
            local_420 = local_420 + 1;
            goto LAB_001039f2;
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_238,"The argument for the -M option must be a ",0x29);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_238,"non-negative integer",0x14);
          local_3d8[0]._M_dataplus._M_p = (pointer)&local_3d8[0].field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_3d8,"bcp","");
          sptk::PrintErrorMessage(local_3d8,(ostringstream *)&local_238);
        }
        goto LAB_00103ec7;
      }
      iVar5 = 2;
      goto LAB_00103f03;
    }
    switch(iVar5) {
    case 0x65:
      std::__cxx11::string::string((string *)&local_238,ya_optarg,(allocator *)local_3d8);
      bVar3 = sptk::ConvertStringToInteger(&local_238,&local_41c);
      bVar14 = -1 < local_41c;
      paVar7 = &local_238.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != paVar7) {
        operator_delete(local_238._M_dataplus._M_p);
        paVar7 = extraout_RAX;
      }
      if (bVar3 && bVar14) {
        local_410 = (char *)CONCAT71((int7)((ulong)paVar7 >> 8),1);
        goto LAB_00103ca8;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_238,"The argument for the -e option must be a ",0x29);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_238,"non-negative integer",0x14);
      local_3d8[0]._M_dataplus._M_p = (pointer)&local_3d8[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_3d8,"bcp","");
      sptk::PrintErrorMessage(local_3d8,(ostringstream *)&local_238);
LAB_00103ec7:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d8[0]._M_dataplus._M_p != &local_3d8[0].field_2) {
        operator_delete(local_3d8[0]._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_238);
      std::ios_base::~ios_base(local_1c8);
      iVar5 = 1;
      iVar13 = 1;
      break;
    case 0x66:
      std::__cxx11::string::string((string *)&local_238,ya_optarg,(allocator *)local_3d8);
      bVar3 = sptk::ConvertStringToDouble(&local_238,&local_3e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p);
      }
      if (!bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_238,"The argument for the -f option must be numeric",0x2e);
        local_3d8[0]._M_dataplus._M_p = (pointer)&local_3d8[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_3d8,"bcp","");
        sptk::PrintErrorMessage(local_3d8,(ostringstream *)&local_238);
        goto LAB_00103ec7;
      }
      iVar5 = 0;
      break;
    case 0x67:
    case 0x69:
    case 0x6a:
    case 0x6b:
    case 0x6e:
    case 0x6f:
    case 0x70:
    case 0x71:
    case 0x72:
switchD_001038ca_caseD_67:
      iVar5 = 1;
      anon_unknown.dwarf_ce22::PrintUsage((ostream *)&std::cerr);
      iVar13 = 1;
      break;
    case 0x68:
      anon_unknown.dwarf_ce22::PrintUsage((ostream *)&std::cout);
      iVar13 = 0;
      iVar5 = 1;
      break;
    case 0x6c:
      std::__cxx11::string::string((string *)&local_238,ya_optarg,(allocator *)local_3d8);
      bVar14 = sptk::ConvertStringToInteger(&local_238,&local_424);
      bVar3 = local_424 < 1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p);
      }
      if (!bVar14 || bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_238,"The argument for the -l option must be a positive integer"
                   ,0x39);
        local_3d8[0]._M_dataplus._M_p = (pointer)&local_3d8[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_3d8,"bcp","");
        sptk::PrintErrorMessage(local_3d8,(ostringstream *)&local_238);
        goto LAB_00103ec7;
      }
      goto LAB_00103ca8;
    case 0x6d:
      std::__cxx11::string::string((string *)&local_238,ya_optarg,(allocator *)local_3d8);
      bVar3 = sptk::ConvertStringToInteger(&local_238,&local_424);
      bVar14 = local_424 < 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p);
      }
      if (!bVar3 || bVar14) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_238,"The argument for the -m option must be a ",0x29);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_238,"non-negative integer",0x14);
        local_3d8[0]._M_dataplus._M_p = (pointer)&local_3d8[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_3d8,"bcp","");
        sptk::PrintErrorMessage(local_3d8,(ostringstream *)&local_238);
        goto LAB_00103ec7;
      }
      local_424 = local_424 + 1;
      goto LAB_00103ca8;
    case 0x73:
      std::__cxx11::string::string((string *)&local_238,ya_optarg,(allocator *)local_3d8);
      bVar3 = sptk::ConvertStringToInteger(&local_238,&local_418);
      bVar14 = local_418 < 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p);
      }
      if (!bVar3 || bVar14) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_238,"The argument for the -s option must be a ",0x29);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_238,"non-negative integer",0x14);
        local_3d8[0]._M_dataplus._M_p = (pointer)&local_3d8[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_3d8,"bcp","");
        sptk::PrintErrorMessage(local_3d8,(ostringstream *)&local_238);
        goto LAB_00103ec7;
      }
      goto LAB_00103ca8;
    default:
      if (iVar5 != 0x53) goto switchD_001038ca_caseD_67;
      std::__cxx11::string::string((string *)&local_238,ya_optarg,(allocator *)local_3d8);
      bVar3 = sptk::ConvertStringToInteger(&local_238,&local_414);
      bVar14 = local_414 < 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p);
      }
      if (!bVar3 || bVar14) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_238,"The argument for the -S option must be a ",0x29);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_238,"non-negative integer",0x14);
        local_3d8[0]._M_dataplus._M_p = (pointer)&local_3d8[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_3d8,"bcp","");
        sptk::PrintErrorMessage(local_3d8,(ostringstream *)&local_238);
        goto LAB_00103ec7;
      }
LAB_00103ca8:
      iVar5 = 0;
    }
LAB_00103f03:
  } while (iVar5 == 0);
  if (iVar5 != 2) goto LAB_001041b2;
  if (((ulong)local_410 & 1) == 0) {
    local_41c = local_424 + -1;
LAB_00103fd2:
    if (local_418 < local_424) {
      iVar5 = (local_41c - local_418) + 1;
      if ((local_408 & 1) == 0) {
        local_420 = iVar5 + local_414;
      }
      else if (local_420 < iVar5 + local_414) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_238,"Output block length is too short",0x20);
        local_3d8[0]._M_dataplus._M_p = (pointer)&local_3d8[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_3d8,"bcp","");
        sptk::PrintErrorMessage(local_3d8,(ostringstream *)&local_238);
        goto LAB_00104177;
      }
      local_408 = CONCAT71(local_408._1_7_,argc - ya_optind < 1);
      uVar6 = argc - ya_optind;
      if (uVar6 == 0 || argc < ya_optind) {
        local_410 = (char *)0x0;
      }
      else {
        ppcVar10 = argv + ((long)argc - (ulong)uVar6);
        local_410 = (char *)0x0;
        lVar11 = (ulong)uVar6 + 1;
        do {
          pcVar1 = *ppcVar10;
          if (*pcVar1 == '+') {
            local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
            sVar9 = strlen(pcVar1);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_238,pcVar1,pcVar1 + sVar9);
            std::__cxx11::string::substr((ulong)local_3d8,(ulong)&local_238);
            std::__cxx11::string::operator=((string *)&local_258,(string *)local_3d8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3d8[0]._M_dataplus._M_p != &local_3d8[0].field_2) {
              operator_delete(local_3d8[0]._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_238._M_dataplus._M_p != &local_238.field_2) {
              operator_delete(local_238._M_dataplus._M_p);
            }
            bVar3 = true;
          }
          else if (local_410 == (char *)0x0) {
            bVar3 = true;
            local_410 = pcVar1;
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_238,"Too many input files",0x14);
            local_3d8[0]._M_dataplus._M_p = (pointer)&local_3d8[0].field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_3d8,"bcp","");
            sptk::PrintErrorMessage(local_3d8,(ostringstream *)&local_238);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3d8[0]._M_dataplus._M_p != &local_3d8[0].field_2) {
              operator_delete(local_3d8[0]._M_dataplus._M_p);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_238);
            std::ios_base::~ios_base(local_1c8);
            iVar13 = 1;
            bVar3 = false;
          }
          if (!bVar3) break;
          lVar12 = lVar11 + -1;
          ppcVar10 = ppcVar10 + 1;
          lVar2 = lVar11 + -3;
          local_408 = CONCAT71(local_408._1_7_,lVar12 < 2);
          lVar11 = lVar12;
        } while (SBORROW8(lVar12,2) == lVar2 < 0);
      }
      if ((local_408 & 1) == 0) goto LAB_001041b2;
      bVar3 = sptk::SetBinaryMode();
      if (!bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_238,"Cannot set translation mode",0x1b);
        local_3d8[0]._M_dataplus._M_p = (pointer)&local_3d8[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_3d8,"bcp","");
        sptk::PrintErrorMessage(local_3d8,(ostringstream *)&local_238);
        goto LAB_00104177;
      }
      this = &local_238;
      std::ifstream::ifstream(this);
      if ((local_410 == (char *)0x0) ||
         (std::ifstream::open((char *)&local_238,(_Ios_Openmode)local_410),
         (abStack_218[*(long *)(local_238._M_dataplus._M_p + -0x18)] & 5) == 0)) {
        cVar4 = std::__basic_file<char>::is_open();
        if (cVar4 == '\0') {
          this = (string *)&std::cin;
        }
        anon_unknown.dwarf_ce22::BlockCopyWrapper::BlockCopyWrapper
                  (&local_260,&local_258,local_418,local_41c,local_424,local_414,local_420,local_3e0
                  );
        if (local_260.block_copy_ == (BlockCopyInterface *)0x0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3d8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_3d8,"Unexpected argument for the +type option",0x28);
          local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_400,"bcp","");
          sptk::PrintErrorMessage(&local_400,(ostringstream *)local_3d8);
LAB_001045fe:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_400._M_dataplus._M_p != &local_400.field_2) {
            operator_delete(local_400._M_dataplus._M_p);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3d8);
          std::ios_base::~ios_base(local_368);
          iVar13 = 1;
        }
        else {
          iVar5 = (*(local_260.block_copy_)->_vptr_BlockCopyInterface[2])
                            (local_260.block_copy_,this);
          iVar13 = 0;
          if ((char)iVar5 == '\0') {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3d8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_3d8,"Failed to copy",0xe);
            local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_400,"bcp","");
            sptk::PrintErrorMessage(&local_400,(ostringstream *)local_3d8);
            goto LAB_001045fe;
          }
        }
        if (local_260.block_copy_ != (BlockCopyInterface *)0x0) {
          (*(local_260.block_copy_)->_vptr_BlockCopyInterface[1])(local_260.block_copy_);
        }
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3d8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_3d8,"Cannot open file ",0x11);
        pcVar1 = local_410;
        sVar9 = strlen(local_410);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3d8,pcVar1,sVar9);
        local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_400,"bcp","");
        sptk::PrintErrorMessage(&local_400,(ostringstream *)local_3d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_400._M_dataplus._M_p != &local_400.field_2) {
          operator_delete(local_400._M_dataplus._M_p);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3d8);
        std::ios_base::~ios_base(local_368);
        iVar13 = 1;
      }
      std::ifstream::~ifstream(&local_238);
      goto LAB_001041b2;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_238,"Start number ",0xd);
    poVar8 = (ostream *)std::ostream::operator<<(&local_238,local_418);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," must be less than block length ",0x20);
    std::ostream::operator<<(poVar8,local_424);
    local_3d8[0]._M_dataplus._M_p = (pointer)&local_3d8[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3d8,"bcp","");
    sptk::PrintErrorMessage(local_3d8,(ostringstream *)&local_238);
  }
  else if (local_41c < local_424) {
    if (local_418 <= local_41c) goto LAB_00103fd2;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_238,"End number ",0xb);
    poVar8 = (ostream *)std::ostream::operator<<(&local_238,local_41c);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," must be equal to or greater than start number ",0x2f);
    std::ostream::operator<<(poVar8,local_418);
    local_3d8[0]._M_dataplus._M_p = (pointer)&local_3d8[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3d8,"bcp","");
    sptk::PrintErrorMessage(local_3d8,(ostringstream *)&local_238);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_238,"End number ",0xb);
    poVar8 = (ostream *)std::ostream::operator<<(&local_238,local_41c);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," must be less than block length ",0x20);
    std::ostream::operator<<(poVar8,local_424);
    local_3d8[0]._M_dataplus._M_p = (pointer)&local_3d8[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3d8,"bcp","");
    sptk::PrintErrorMessage(local_3d8,(ostringstream *)&local_238);
  }
LAB_00104177:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8[0]._M_dataplus._M_p != &local_3d8[0].field_2) {
    operator_delete(local_3d8[0]._M_dataplus._M_p);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_238);
  std::ios_base::~ios_base(local_1c8);
  iVar13 = 1;
LAB_001041b2:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p);
  }
  return iVar13;
}

Assistant:

int main(int argc, char* argv[]) {
  int input_start_number(kDefaultInputStartNumber);
  int input_end_number(kDefaultInputBlockLength - 1);
  int input_block_length(kDefaultInputBlockLength);
  int output_start_number(kDefaultOutputStartNumber);
  int output_block_length(kDefaultInputBlockLength);
  double pad_value(kDefaultPadValue);
  std::string data_type(kDefaultDataType);
  bool is_input_end_number_specified(false);
  bool is_output_block_length_specified(false);

  for (;;) {
    const int option_char(
        getopt_long(argc, argv, "s:e:l:m:S:L:M:f:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 's': {
        if (!sptk::ConvertStringToInteger(optarg, &input_start_number) ||
            input_start_number < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -s option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("bcp", error_message);
          return 1;
        }
        break;
      }
      case 'e': {
        if (!sptk::ConvertStringToInteger(optarg, &input_end_number) ||
            input_end_number < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -e option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("bcp", error_message);
          return 1;
        }
        is_input_end_number_specified = true;
        break;
      }
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &input_block_length) ||
            input_block_length <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -l option must be a positive integer";
          sptk::PrintErrorMessage("bcp", error_message);
          return 1;
        }
        break;
      }
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &input_block_length) ||
            input_block_length < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("bcp", error_message);
          return 1;
        }
        ++input_block_length;
        break;
      }
      case 'S': {
        if (!sptk::ConvertStringToInteger(optarg, &output_start_number) ||
            output_start_number < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -S option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("bcp", error_message);
          return 1;
        }
        break;
      }
      case 'L': {
        if (!sptk::ConvertStringToInteger(optarg, &output_block_length) ||
            output_block_length <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -L option must be a positive integer";
          sptk::PrintErrorMessage("bcp", error_message);
          return 1;
        }
        is_output_block_length_specified = true;
        break;
      }
      case 'M': {
        if (!sptk::ConvertStringToInteger(optarg, &output_block_length) ||
            output_block_length < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -M option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("bcp", error_message);
          return 1;
        }
        ++output_block_length;
        is_output_block_length_specified = true;
        break;
      }
      case 'f': {
        if (!sptk::ConvertStringToDouble(optarg, &pad_value)) {
          std::ostringstream error_message;
          error_message << "The argument for the -f option must be numeric";
          sptk::PrintErrorMessage("bcp", error_message);
          return 1;
        }
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  if (!is_input_end_number_specified) {
    input_end_number = input_block_length - 1;
  } else if (input_block_length <= input_end_number) {
    std::ostringstream error_message;
    error_message << "End number " << input_end_number
                  << " must be less than block length " << input_block_length;
    sptk::PrintErrorMessage("bcp", error_message);
    return 1;
  } else if (input_end_number < input_start_number) {
    std::ostringstream error_message;
    error_message << "End number " << input_end_number
                  << " must be equal to or greater than start number "
                  << input_start_number;
    sptk::PrintErrorMessage("bcp", error_message);
    return 1;
  }

  if (input_block_length <= input_start_number) {
    std::ostringstream error_message;
    error_message << "Start number " << input_start_number
                  << " must be less than block length " << input_block_length;
    sptk::PrintErrorMessage("bcp", error_message);
    return 1;
  }

  const int copy_length(input_end_number - input_start_number + 1);
  if (!is_output_block_length_specified) {
    output_block_length = output_start_number + copy_length;
  } else if (output_block_length < output_start_number + copy_length) {
    std::ostringstream error_message;
    error_message << "Output block length is too short";
    sptk::PrintErrorMessage("bcp", error_message);
    return 1;
  }

  const char* input_file(NULL);
  for (int i(argc - optind); 1 <= i; --i) {
    const char* arg(argv[argc - i]);
    if (0 == std::strncmp(arg, "+", 1)) {
      const std::string str(arg);
      data_type = str.substr(1, std::string::npos);
    } else if (NULL == input_file) {
      input_file = arg;
    } else {
      std::ostringstream error_message;
      error_message << "Too many input files";
      sptk::PrintErrorMessage("bcp", error_message);
      return 1;
    }
  }

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("bcp", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("bcp", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  BlockCopyWrapper block_copy(data_type, input_start_number, input_end_number,
                              input_block_length, output_start_number,
                              output_block_length, pad_value);

  if (!block_copy.IsValid()) {
    std::ostringstream error_message;
    error_message << "Unexpected argument for the +type option";
    sptk::PrintErrorMessage("bcp", error_message);
    return 1;
  }

  if (!block_copy.Run(&input_stream)) {
    std::ostringstream error_message;
    error_message << "Failed to copy";
    sptk::PrintErrorMessage("bcp", error_message);
    return 1;
  }

  return 0;
}